

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdin(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char buffer [23];
  uv_buf_t buf;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_pipe_t out;
  uv_write_t write_req;
  
  builtin_strncpy(buffer,"hello-from-spawn_stdin",0x17);
  init_process_options("spawn_helper3",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&out,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  stdio[1].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 2;
  stdio[0].data.stream = (uv_stream_t *)&in;
  stdio[1].data.stream = (uv_stream_t *)&out;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    buf.len = 0x17;
    buf.base = buffer;
    iVar1 = uv_write(&write_req,(uv_stream_t *)&in,&buf,1,write_cb);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          if (exit_cb_called == 1) {
            if (close_cb_called == 3) {
              iVar1 = strcmp(buffer,output);
              if (iVar1 == 0) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar3 = 0x26a;
              }
              else {
                pcVar4 = "strcmp(buffer, output) == 0";
                uVar3 = 0x268;
              }
            }
            else {
              pcVar4 = "close_cb_called == 3";
              uVar3 = 0x267;
            }
          }
          else {
            pcVar4 = "exit_cb_called == 1";
            uVar3 = 0x266;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x264;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x261;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x25e;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x259;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdin) {
  int r;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  char buffer[] = "hello-from-spawn_stdin";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  buf.base = buffer;
  buf.len = sizeof(buffer);
  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3); /* Once for process twice for the pipe. */
  ASSERT(strcmp(buffer, output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}